

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
          (Generator *this,Descriptor *descriptor,DescriptorProto *proto)

{
  int iVar1;
  AlphaNum *this_00;
  long in_RDI;
  int offset;
  string sp;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  LogMessage *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffec0;
  AlphaNum *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  char (*in_stack_ffffffffffffff00) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  char (*in_stack_ffffffffffffff10) [17];
  char *in_stack_ffffffffffffff18;
  Printer *in_stack_ffffffffffffff20;
  string local_a8 [32];
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar2;
  Descriptor *in_stack_ffffffffffffff80;
  string local_38 [56];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Descriptor::CopyTo(in_stack_ffffffffffffff80,
                     (DescriptorProto *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::__cxx11::string::string(local_38);
  MessageLite::SerializeToString
            ((MessageLite *)in_stack_fffffffffffffeb0,
             (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  iVar1 = std::__cxx11::string::find((string *)(in_RDI + 0x38),(ulong)local_38);
  bVar2 = 0;
  if (iVar1 < 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffec0,level,(char *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    bVar2 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffeb0,
               (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffeb0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if ((bVar2 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4c7580);
  }
  strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  StrCat_abi_cxx11_(in_stack_fffffffffffffee8);
  this_00 = (AlphaNum *)(long)iVar1;
  std::__cxx11::string::size();
  strings::AlphaNum::AlphaNum(this_00,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  StrCat_abi_cxx11_(in_stack_fffffffffffffee8);
  io::Printer::Print<char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(const DescriptorT& descriptor,
                                          DescriptorProtoT& proto) const {
  descriptor.CopyTo(&proto);
  std::string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print(
      "serialized_start=$serialized_start$,\n"
      "serialized_end=$serialized_end$,\n",
      "serialized_start", StrCat(offset), "serialized_end",
      StrCat(offset + sp.size()));
}